

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsEntitiesToSides(FmsIntType idx_type,FmsInt ent_sides,FmsInt loc_side_begin,
                      FmsInt num_loc_sides,void *ents,FmsInt side_sides,void *sides,
                      FmsInt res_stride,FmsInt res_off,FmsInt *res,FmsInt num_ents)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  long in_R8;
  ulong in_R9;
  long in_stack_00000008;
  FmsInt ss_id_7;
  FmsInt *res_side_7;
  uint64_t *side_7;
  uint64_t side_id_7;
  FmsInt loc_off_7;
  FmsInt *res_ent_7;
  uint64_t *ent_off_7;
  FmsInt ent_id_7;
  uint64_t *sides__7;
  uint64_t *ents__7;
  FmsInt ss_id_6;
  FmsInt *res_side_6;
  uint32_t *side_6;
  uint32_t side_id_6;
  FmsInt loc_off_6;
  FmsInt *res_ent_6;
  uint32_t *ent_off_6;
  FmsInt ent_id_6;
  uint32_t *sides__6;
  uint32_t *ents__6;
  FmsInt ss_id_5;
  FmsInt *res_side_5;
  uint16_t *side_5;
  uint16_t side_id_5;
  FmsInt loc_off_5;
  FmsInt *res_ent_5;
  uint16_t *ent_off_5;
  FmsInt ent_id_5;
  uint16_t *sides__5;
  uint16_t *ents__5;
  FmsInt ss_id_4;
  FmsInt *res_side_4;
  uint8_t *side_4;
  uint8_t side_id_4;
  FmsInt loc_off_4;
  FmsInt *res_ent_4;
  uint8_t *ent_off_4;
  FmsInt ent_id_4;
  uint8_t *sides__4;
  uint8_t *ents__4;
  FmsInt ss_id_3;
  FmsInt *res_side_3;
  int64_t *side_3;
  int64_t side_id_3;
  FmsInt loc_off_3;
  FmsInt *res_ent_3;
  int64_t *ent_off_3;
  FmsInt ent_id_3;
  int64_t *sides__3;
  int64_t *ents__3;
  FmsInt ss_id_2;
  FmsInt *res_side_2;
  int32_t *side_2;
  int32_t side_id_2;
  FmsInt loc_off_2;
  FmsInt *res_ent_2;
  int32_t *ent_off_2;
  FmsInt ent_id_2;
  int32_t *sides__2;
  int32_t *ents__2;
  FmsInt ss_id_1;
  FmsInt *res_side_1;
  int16_t *side_1;
  int16_t side_id_1;
  FmsInt loc_off_1;
  FmsInt *res_ent_1;
  int16_t *ent_off_1;
  FmsInt ent_id_1;
  int16_t *sides__1;
  int16_t *ents__1;
  FmsInt ss_id;
  FmsInt *res_side;
  int8_t *side;
  int8_t side_id;
  FmsInt loc_off;
  FmsInt *res_ent;
  int8_t *ent_off;
  FmsInt ent_id;
  int8_t *sides_;
  int8_t *ents_;
  FmsInt *res_;
  ulong local_2b8;
  ulong local_298;
  ulong local_280;
  ulong local_268;
  ulong local_248;
  ulong local_230;
  ulong local_218;
  ulong local_1f8;
  ulong local_1e0;
  ulong local_1c8;
  ulong local_1a8;
  ulong local_190;
  ulong local_178;
  ulong local_158;
  ulong local_140;
  ulong local_128;
  ulong local_108;
  ulong local_f0;
  ulong local_d8;
  ulong local_b8;
  ulong local_a0;
  ulong local_88;
  ulong local_68;
  ulong local_50;
  int local_4;
  
  if (in_EDI < 8) {
    switch(in_EDI) {
    case 0:
      for (local_50 = 0; local_50 < side_id_7; local_50 = local_50 + 1) {
        for (local_68 = 0; local_68 < in_RCX; local_68 = local_68 + 1) {
          cVar1 = *(char *)(in_R8 + in_RDX + local_50 * in_RSI + local_68);
          for (local_88 = 0; local_88 < in_R9; local_88 = local_88 + 1) {
            side_7[(long)res_side_7 + local_50 * ss_id_7 + local_68 * in_R9 + local_88] =
                 (long)*(char *)(in_stack_00000008 + (long)cVar1 * in_R9 + local_88);
          }
        }
      }
      break;
    case 1:
      for (local_a0 = 0; local_a0 < side_id_7; local_a0 = local_a0 + 1) {
        for (local_b8 = 0; local_b8 < in_RCX; local_b8 = local_b8 + 1) {
          sVar3 = *(short *)(in_R8 + in_RDX * 2 + local_a0 * in_RSI * 2 + local_b8 * 2);
          for (local_d8 = 0; local_d8 < in_R9; local_d8 = local_d8 + 1) {
            side_7[(long)res_side_7 + local_a0 * ss_id_7 + local_b8 * in_R9 + local_d8] =
                 (long)*(short *)(in_stack_00000008 + (long)sVar3 * in_R9 * 2 + local_d8 * 2);
          }
        }
      }
      break;
    case 2:
      for (local_f0 = 0; local_f0 < side_id_7; local_f0 = local_f0 + 1) {
        for (local_108 = 0; local_108 < in_RCX; local_108 = local_108 + 1) {
          iVar5 = *(int *)(in_R8 + in_RDX * 4 + local_f0 * in_RSI * 4 + local_108 * 4);
          for (local_128 = 0; local_128 < in_R9; local_128 = local_128 + 1) {
            side_7[(long)res_side_7 + local_f0 * ss_id_7 + local_108 * in_R9 + local_128] =
                 (long)*(int *)(in_stack_00000008 + (long)iVar5 * in_R9 * 4 + local_128 * 4);
          }
        }
      }
      break;
    case 3:
      for (local_140 = 0; local_140 < side_id_7; local_140 = local_140 + 1) {
        for (local_158 = 0; local_158 < in_RCX; local_158 = local_158 + 1) {
          lVar7 = *(long *)(in_R8 + in_RDX * 8 + local_140 * in_RSI * 8 + local_158 * 8);
          for (local_178 = 0; local_178 < in_R9; local_178 = local_178 + 1) {
            side_7[(long)res_side_7 + local_140 * ss_id_7 + local_158 * in_R9 + local_178] =
                 *(uint64_t *)(in_stack_00000008 + lVar7 * in_R9 * 8 + local_178 * 8);
          }
        }
      }
      break;
    case 4:
      for (local_190 = 0; local_190 < side_id_7; local_190 = local_190 + 1) {
        for (local_1a8 = 0; local_1a8 < in_RCX; local_1a8 = local_1a8 + 1) {
          bVar2 = *(byte *)(in_R8 + in_RDX + local_190 * in_RSI + local_1a8);
          for (local_1c8 = 0; local_1c8 < in_R9; local_1c8 = local_1c8 + 1) {
            side_7[(long)res_side_7 + local_190 * ss_id_7 + local_1a8 * in_R9 + local_1c8] =
                 (ulong)*(byte *)(in_stack_00000008 + bVar2 * in_R9 + local_1c8);
          }
        }
      }
      break;
    case 5:
      for (local_1e0 = 0; local_1e0 < side_id_7; local_1e0 = local_1e0 + 1) {
        for (local_1f8 = 0; local_1f8 < in_RCX; local_1f8 = local_1f8 + 1) {
          uVar4 = *(ushort *)(in_R8 + in_RDX * 2 + local_1e0 * in_RSI * 2 + local_1f8 * 2);
          for (local_218 = 0; local_218 < in_R9; local_218 = local_218 + 1) {
            side_7[(long)res_side_7 + local_1e0 * ss_id_7 + local_1f8 * in_R9 + local_218] =
                 (ulong)*(ushort *)(in_stack_00000008 + uVar4 * in_R9 * 2 + local_218 * 2);
          }
        }
      }
      break;
    case 6:
      for (local_230 = 0; local_230 < side_id_7; local_230 = local_230 + 1) {
        for (local_248 = 0; local_248 < in_RCX; local_248 = local_248 + 1) {
          uVar6 = *(uint *)(in_R8 + in_RDX * 4 + local_230 * in_RSI * 4 + local_248 * 4);
          for (local_268 = 0; local_268 < in_R9; local_268 = local_268 + 1) {
            side_7[(long)res_side_7 + local_230 * ss_id_7 + local_248 * in_R9 + local_268] =
                 (ulong)*(uint *)(in_stack_00000008 + uVar6 * in_R9 * 4 + local_268 * 4);
          }
        }
      }
      break;
    case 7:
      for (local_280 = 0; local_280 < side_id_7; local_280 = local_280 + 1) {
        for (local_298 = 0; local_298 < in_RCX; local_298 = local_298 + 1) {
          lVar7 = *(long *)(in_R8 + in_RDX * 8 + local_280 * in_RSI * 8 + local_298 * 8);
          for (local_2b8 = 0; local_2b8 < in_R9; local_2b8 = local_2b8 + 1) {
            side_7[(long)res_side_7 + local_280 * ss_id_7 + local_298 * in_R9 + local_2b8] =
                 *(uint64_t *)(in_stack_00000008 + lVar7 * in_R9 * 8 + local_2b8 * 8);
          }
        }
      }
      break;
    default:
      FmsAbortNotImplemented();
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int FmsEntitiesToSides(FmsIntType idx_type, FmsInt ent_sides,
                              FmsInt loc_side_begin, FmsInt num_loc_sides,
                              const void *ents, FmsInt side_sides,
                              const void *sides, FmsInt res_stride,
                              FmsInt res_off, FmsInt *res, FmsInt num_ents) {
  if (idx_type >= FMS_NUM_INT_TYPES) { E_RETURN(1); }
  FmsInt *res_ = res + res_off;
  switch (idx_type) {
  case FMS_INT8:   FMS_E2S_TEMPL(int8_t);
  case FMS_INT16:  FMS_E2S_TEMPL(int16_t);
  case FMS_INT32:  FMS_E2S_TEMPL(int32_t);
  case FMS_INT64:  FMS_E2S_TEMPL(int64_t);
  case FMS_UINT8:  FMS_E2S_TEMPL(uint8_t);
  case FMS_UINT16: FMS_E2S_TEMPL(uint16_t);
  case FMS_UINT32: FMS_E2S_TEMPL(uint32_t);
  case FMS_UINT64: FMS_E2S_TEMPL(uint64_t);
  default: FmsAbortNotImplemented();
  }
  return 0;
}